

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O2

string * __thiscall
hdc::Parameter::getUniqueCppName_abi_cxx11_(string *__return_storage_ptr__,Parameter *this)

{
  ostream *poVar1;
  string local_1c0;
  stringstream s;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = std::operator<<(local_190,'p');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Variable).localName);
  poVar1 = std::operator<<(poVar1,'_');
  Variable::getName_abi_cxx11_(&local_1c0,&this->super_Variable);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string Parameter::getUniqueCppName() {
    std::stringstream s;

    s << 'p' << localName << '_' << getName();
    return s.str();
}